

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          shared_ptr<polyscope::render::AttributeBuffer> *externalBuffer)

{
  bool bVar1;
  __type _Var2;
  RenderDataType r2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *this_00;
  invalid_argument *piVar4;
  socklen_t in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  sockaddr *__addr;
  int __fd;
  GLShaderProgram *in_RDI;
  shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> engineExtBuff;
  int compatCount;
  GLShaderAttribute *a;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
  *__range2;
  vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
  *in_stack_fffffffffffffdb8;
  shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  GLShaderAttribute *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  RenderDataType r1;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined1 uVar5;
  char *in_stack_fffffffffffffe08;
  RenderDataType *in_stack_fffffffffffffe48;
  string local_1b0 [32];
  __shared_ptr local_190 [23];
  undefined1 local_179;
  string local_158 [35];
  undefined1 local_135;
  RenderDataType local_134;
  string local_60 [36];
  int local_3c;
  reference local_38;
  GLShaderAttribute *local_30;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
  local_28;
  vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
  *local_20;
  
  bindVAO(in_RDI);
  checkGLError(true);
  local_20 = &in_RDI->attributes;
  local_28._M_current =
       (GLShaderAttribute *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
       ::begin(in_stack_fffffffffffffdb8);
  local_30 = (GLShaderAttribute *)
             std::
             vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
             ::end(in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) {
      uVar5 = 1;
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_fffffffffffffe08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe00));
      std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xfffffffffffffe08);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_38 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
               ::operator*(&local_28);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            &in_stack_fffffffffffffdd8->name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>_>
    ::operator++(&local_28);
  }
  r1 = local_38->type;
  peVar3 = std::
           __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x513647);
  r2 = AttributeBuffer::getType(peVar3);
  local_3c = renderDataTypeCountCompatbility(r1,r2);
  if (local_3c == 0) {
    local_135 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffe08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    renderDataTypeName_abi_cxx11_(in_stack_fffffffffffffe48);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   in_RDX);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    peVar3 = std::
             __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x513721);
    local_134 = AttributeBuffer::getType(peVar3);
    renderDataTypeName_abi_cxx11_(in_stack_fffffffffffffe48);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   in_RDX);
    std::invalid_argument::invalid_argument(piVar4,local_60);
    local_135 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38->buff);
  if (bVar1) {
    local_179 = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffe08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    std::operator+(__lhs,(char *)in_stack_fffffffffffffdc0);
    std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_158);
    local_179 = 0;
    __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL_mock::GLAttributeBuffer,polyscope::render::AttributeBuffer>
            ((shared_ptr<polyscope::render::AttributeBuffer> *)in_stack_fffffffffffffdd8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_190);
  if (!bVar1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffe08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    std::operator+(in_stack_fffffffffffffdc8,(char *)piVar4);
    std::invalid_argument::invalid_argument(piVar4,local_1b0);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __fd = (int)local_190;
  std::shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer>::operator=
            (in_stack_fffffffffffffdc0,
             (shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> *)
             in_stack_fffffffffffffdb8);
  this_00 = std::
            __shared_ptr_access<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x513b2b);
  GLAttributeBuffer::bind(this_00,__fd,__addr,in_ECX);
  assignBufferToVAO((GLShaderProgram *)CONCAT44(r1,in_stack_fffffffffffffde0),
                    in_stack_fffffffffffffdd8);
  std::shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> *)0x513b54);
  return;
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, std::shared_ptr<AttributeBuffer> externalBuffer) {
  bindVAO();
  checkGLError();

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {

      // check that types match
      int compatCount = renderDataTypeCountCompatbility(a.type, externalBuffer->getType());
      if (compatCount == 0)
        throw std::invalid_argument("Tried to set attribute " + name + " to incompatibile type. Attribute " +
                                    renderDataTypeName(a.type) + " set with buffer of type " +
                                    renderDataTypeName(externalBuffer->getType()));

      // check multiple-set errors (duplicates in externalBuffers list?)
      if (a.buff) throw std::invalid_argument("attribute " + name + " is already set");

      // cast to the engine type (booooooo)
      std::shared_ptr<GLAttributeBuffer> engineExtBuff = std::dynamic_pointer_cast<GLAttributeBuffer>(externalBuffer);
      if (!engineExtBuff) throw std::invalid_argument("attribute " + name + " external buffer engine type cast failed");

      a.buff = engineExtBuff;

      a.buff->bind();

      assignBufferToVAO(a);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}